

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  TypeFunction *pTVar1;
  TypeBase *pTVar2;
  bool bVar3;
  uint uVar4;
  bool_type bVar5;
  ArgumentData *pAVar6;
  uint local_80;
  uint i;
  bool match;
  TypeHandle *leftArg;
  TypeFunction *type;
  Node curr;
  TypeBase *returnType_local;
  uint hash_local;
  DirectChainedMap<TypeFunction_*> *table_local;
  ArrayView<ArgumentData> arguments_local;
  
  table_local = (DirectChainedMap<TypeFunction_*> *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  curr.node = (Node *)returnType;
  _type = DirectChainedMap<TypeFunction_*>::first(table,hash);
  bVar5 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer((NodeIterator *)&type);
  if (bVar5 != 0) {
    while (bVar5 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                             ((NodeIterator *)&type), bVar5 != 0) {
      pTVar1 = *(TypeFunction **)(curr.start + 8);
      if (pTVar1->returnType == (TypeBase *)curr.node) {
        _i = (pTVar1->arguments).head;
        bVar3 = true;
        for (local_80 = 0;
            uVar4 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&table_local),
            local_80 < uVar4; local_80 = local_80 + 1) {
          if ((_i == (TypeHandle *)0x0) ||
             (pTVar2 = _i->type,
             pAVar6 = ArrayView<ArgumentData>::operator[]
                                ((ArrayView<ArgumentData> *)&table_local,local_80),
             pTVar2 != pAVar6->type)) {
            bVar3 = false;
            break;
          }
          _i = _i->next;
        }
        if ((bVar3) && (_i == (TypeHandle *)0x0)) {
          return pTVar1;
        }
        _type = DirectChainedMap<TypeFunction_*>::next(table,_type);
      }
      else {
        _type = DirectChainedMap<TypeFunction_*>::next(table,_type);
      }
    }
  }
  return (TypeFunction *)0x0;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;

			bool match = true;

			for(unsigned i = 0; i < arguments.size(); i++)
			{
				if(!leftArg || leftArg->type != arguments[i].type)
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match || leftArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}